

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_session_free(nh_session_t *session)

{
  epoll_ctl(session->server->loop,2,session->socket,(epoll_event *)0x0);
  epoll_ctl(session->server->loop,2,session->timer_fd,(epoll_event *)0x0);
  close(session->timer_fd);
  close(session->socket);
  nh_context_clear(&session->context);
  free(session);
  return;
}

Assistant:

void nh_session_free(nh_session_t *session) {
    // clear events
    epoll_ctl(session->server->loop, EPOLL_CTL_DEL, session->socket, NULL);
    epoll_ctl(session->server->loop, EPOLL_CTL_DEL, session->timer_fd, NULL);
    // close fd
    close(session->timer_fd);
    close(session->socket);
    // free memory
    nh_context_clear(&session->context);
    free(session);
}